

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O3

ExpandMacroResult __thiscall
anon_unknown.dwarf_a97fa0::EnvironmentMacroExpander<cmCMakePresetsGraph::WorkflowPreset>::operator()
          (EnvironmentMacroExpander<cmCMakePresetsGraph::WorkflowPreset> *this,
          string *macroNamespace,string *macroName,string *macroOut,int version)

{
  MacroExpanderVector *macroExpanders;
  int iVar1;
  ExpandMacroResult EVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_58;
  bool local_38;
  
  iVar1 = std::__cxx11::string::compare((char *)macroNamespace);
  if ((((iVar1 == 0) && (macroName->_M_string_length != 0)) &&
      ((this->Out->super__Optional_base<cmCMakePresetsGraph::WorkflowPreset,_false,_false>).
       _M_payload.super__Optional_payload<cmCMakePresetsGraph::WorkflowPreset,_true,_false,_false>.
       super__Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>._M_engaged == true)) &&
     ((iVar3 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::find(&(this->Out->
                       super__Optional_base<cmCMakePresetsGraph::WorkflowPreset,_false,_false>).
                       _M_payload.
                       super__Optional_payload<cmCMakePresetsGraph::WorkflowPreset,_true,_false,_false>
                       .super__Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>._M_payload
                       ._M_value.super_Preset.Environment._M_t,macroName),
      iVar3._M_node !=
      (_Base_ptr)
      ((long)&(this->Out->super__Optional_base<cmCMakePresetsGraph::WorkflowPreset,_false,_false>).
              _M_payload.
              super__Optional_payload<cmCMakePresetsGraph::WorkflowPreset,_true,_false,_false>.
              super__Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>._M_payload + 0xb0)
      && ((char)iVar3._M_node[3]._M_color == _S_black)))) {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
             ::operator[](this->EnvCycles,macroName);
    if (*pmVar4 == InProgress) {
      return Error;
    }
    if (*pmVar4 != Verified) {
      macroExpanders = this->MacroExpanders;
      *pmVar4 = InProgress;
      EVar2 = cmCMakePresetsGraphInternal::ExpandMacros
                        ((string *)(iVar3._M_node + 2),macroExpanders,version);
      if (EVar2 != Ok) {
        return EVar2;
      }
      *pmVar4 = Verified;
    }
    std::__cxx11::string::_M_append((char *)macroOut,*(ulong *)(iVar3._M_node + 2));
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)macroNamespace);
    if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)macroNamespace), iVar1 != 0))
    {
      return Ignore;
    }
    if (macroName->_M_string_length == 0) {
      return Error;
    }
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_58,macroName);
    if (local_38 == true) {
      std::__cxx11::string::_M_append((char *)macroOut,(ulong)local_58._M_value._M_dataplus._M_p);
    }
    if (((local_38 & 1U) != 0) &&
       (local_38 = false,
       local_58._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_58._M_value + 0x10))) {
      operator_delete((void *)local_58._M_value._M_dataplus._M_p,local_58._16_8_ + 1);
    }
  }
  return Ok;
}

Assistant:

ExpandMacroResult operator()(const std::string& macroNamespace,
                               const std::string& macroName,
                               std::string& macroOut,
                               int version) const override
  {
    if (macroNamespace == "env" && !macroName.empty() && Out) {
      auto v = Out->Environment.find(macroName);
      if (v != Out->Environment.end() && v->second) {
        auto e =
          VisitEnv(*v->second, EnvCycles[macroName], MacroExpanders, version);
        if (e != ExpandMacroResult::Ok) {
          return e;
        }
        macroOut += *v->second;
        return ExpandMacroResult::Ok;
      }
    }

    if (macroNamespace == "env" || macroNamespace == "penv") {
      if (macroName.empty()) {
        return ExpandMacroResult::Error;
      }
      if (cm::optional<std::string> value =
            cmSystemTools::GetEnvVar(macroName)) {
        macroOut += *value;
      }
      return ExpandMacroResult::Ok;
    }

    return ExpandMacroResult::Ignore;
  }